

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O2

char * upack_str(char **buf)

{
  ck_uint32 cVar1;
  char *__dest;
  ulong __n;
  
  cVar1 = upack_int(buf);
  if (cVar1 == 0) {
    __dest = (char *)emalloc(1);
    *__dest = '\0';
  }
  else {
    __n = (ulong)cVar1;
    __dest = (char *)emalloc(__n + 1);
    memcpy(__dest,*buf,__n);
    __dest[__n] = '\0';
    *buf = *buf + __n;
  }
  return __dest;
}

Assistant:

static char *upack_str(char **buf)
{
    char *val;
    size_t strsz;

    strsz = (size_t) upack_int(buf);

    if(strsz > 0)
    {
        val = (char *)emalloc(strsz + 1);
        memcpy(val, *buf, strsz);
        val[strsz] = 0;
        *buf += strsz;
    }
    else
    {
        val = (char *)emalloc(1);
        *val = 0;
    }

    return val;
}